

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

type_conflict1 __thiscall
llama_model_loader::get_arr_n<unsigned_int>
          (llama_model_loader *this,llm_kv kid,uint *result,bool required)

{
  type_conflict1 tVar1;
  string local_40;
  
  LLM_KV::operator()[abi_cxx11_(&local_40,&this->llm_kv,kid);
  tVar1 = get_arr_n<unsigned_int>(this,&local_40,result,required);
  std::__cxx11::string::~string((string *)&local_40);
  return tVar1;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type
    llama_model_loader::get_arr_n(enum llm_kv kid, T & result, bool required) {
        return get_arr_n(llm_kv(kid), result, required);
    }